

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int Abc_NtkBmSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iMatchPairs,Vec_Ptr_t *oMatchPairs,
                Vec_Int_t *mismatch,int mode)

{
  int iVar1;
  Vec_Ptr_t *vPairs_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int *piVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNtkMiter;
  Vec_Ptr_t *vPairs;
  Abc_Obj_t *pObj;
  int i;
  int RetValue;
  Abc_Ntk_t *pCnf;
  Abc_Ntk_t *pMiter;
  int mode_local;
  Vec_Int_t *mismatch_local;
  Vec_Ptr_t *oMatchPairs_local;
  Vec_Ptr_t *iMatchPairs_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pCnf = (Abc_Ntk_t *)0x0;
  if (mode == 0) {
    pCnf = Abc_NtkMiterBm(pNtk1,pNtk2,iMatchPairs,oMatchPairs);
  }
  else if (mode == 1) {
    vPairs_00 = Vec_PtrAlloc(100);
    for (pObj._0_4_ = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)0x0), (int)pObj < iVar1;
        pObj._0_4_ = (int)pObj + 1) {
      pAVar2 = Abc_NtkCo((Abc_Ntk_t *)0x0,(int)pObj);
      Abc_ObjRemoveFanins(pAVar2);
    }
    for (pObj._0_4_ = 0; iVar1 = Vec_PtrSize(oMatchPairs), (int)pObj < iVar1;
        pObj._0_4_ = (int)pObj + 2) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(oMatchPairs,(int)pObj);
      pAVar2 = Abc_ObjChild0Copy(pAVar2);
      Vec_PtrPush(vPairs_00,pAVar2);
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(oMatchPairs,(int)pObj + 1);
      pAVar2 = Abc_ObjChild0Copy(pAVar2);
      Vec_PtrPush(vPairs_00,pAVar2);
    }
    pAVar2 = Abc_AigMiter(pARam0000000000000100,vPairs_00,0);
    pObj_00 = Abc_NtkPo((Abc_Ntk_t *)0x0,0);
    Abc_ObjAddFanin(pObj_00,pAVar2);
    Vec_PtrFree(vPairs_00);
  }
  if (pCnf == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.");
    pNtk1_local._4_4_ = -1;
  }
  else {
    pNtk1_local._4_4_ = Abc_NtkMiterIsConstant(pCnf);
    if (pNtk1_local._4_4_ == 0) {
      if (mismatch != (Vec_Int_t *)0x0) {
        piVar3 = Abc_NtkVerifyGetCleanModel(pCnf,1);
        pCnf->pModel = piVar3;
        Abc_NtkVerifyReportError(pNtk1,pNtk2,pCnf->pModel,mismatch);
        if (pCnf->pModel != (int *)0x0) {
          free(pCnf->pModel);
          pCnf->pModel = (int *)0x0;
        }
      }
      Abc_NtkDelete(pCnf);
    }
    else if (pNtk1_local._4_4_ == 1) {
      Abc_NtkDelete(pCnf);
    }
    else {
      pNtk = Abc_NtkMulti(pCnf,0,100,1,0,0,0);
      Abc_NtkDelete(pCnf);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        printf("Renoding for CNF has failed.");
        pNtk1_local._4_4_ = -1;
      }
      else {
        pNtk1_local._4_4_ = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        if ((mismatch != (Vec_Int_t *)0x0) && (pNtk->pModel != (int *)0x0)) {
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pNtk->pModel,mismatch);
        }
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk->pModel = (int *)0x0;
        }
        Abc_NtkDelete(pNtk);
      }
    }
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkBmSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iMatchPairs, Vec_Ptr_t * oMatchPairs, Vec_Int_t * mismatch, int mode)
{    
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );	

	Abc_Ntk_t * pMiter = NULL;
    Abc_Ntk_t * pCnf;
    int RetValue;

	// get the miter of the two networks
	if( mode == 0 )
	{
		//Abc_NtkDelete( pMiter );
		pMiter = Abc_NtkMiterBm( pNtk1, pNtk2, iMatchPairs, oMatchPairs );
	}
	else if( mode == 1 )		// add new outputs
	{		
		int i;
		Abc_Obj_t * pObj;
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pNtkMiter;		

		vPairs = Vec_PtrAlloc( 100 );

		Abc_NtkForEachCo( pMiter, pObj, i )			
			Abc_ObjRemoveFanins( pObj );

		for(i = 0; i < Vec_PtrSize( oMatchPairs ); i += 2)
		{
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i)) );
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i+1)) );
		}
		pNtkMiter = Abc_AigMiter( (Abc_Aig_t *)pMiter->pManFunc, vPairs, 0 );
		Abc_ObjAddFanin( Abc_NtkPo(pMiter,0), pNtkMiter );	 
		Vec_PtrFree( vPairs);
	}
	else if( mode == 2 )		// add some outputs
	{

	}
	else if( mode == 3)			// remove all outputs
	{
	}

	if ( pMiter == NULL )
	{
		printf("Miter computation has failed.");		
		return -1;
	}
	RetValue = Abc_NtkMiterIsConstant( pMiter );
	if ( RetValue == 0)
	{		
		/*printf("Networks are NOT EQUIVALENT after structural hashing.");	*/
		// report the error    	
		if(mismatch != NULL)
		{
			pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
			Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel, mismatch );
			ABC_FREE( pMiter->pModel );
		}        
		Abc_NtkDelete( pMiter );
        return RetValue;
	}
	if( RetValue == 1 )
	{		
		/*printf("Networks are equivalent after structural hashing.");	*/
		Abc_NtkDelete( pMiter );
		return RetValue;
	}

	// convert the miter into a CNF
	//if(mode == 0)
	pCnf = Abc_NtkMulti( pMiter, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pCnf == NULL )
    {        
		printf("Renoding for CNF has failed.");	
        return -1;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)10000, (ABC_INT64_T)0, 0, NULL, NULL);
    /*if ( RetValue == -1 )
		printf("Networks are undecided (SAT solver timed out).");	
    else if ( RetValue == 0 )        
		printf("Networks are NOT EQUIVALENT after SAT.");	
    else
		printf("Networks are equivalent after SAT.");	*/
	if ( mismatch != NULL && pCnf->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pCnf->pModel, mismatch );

    ABC_FREE( pCnf->pModel );
    Abc_NtkDelete( pCnf );

	return RetValue;
}